

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

ostream * despot::operator<<(ostream *os,vector<int,_std::allocator<int>_> *vec)

{
  char *pcVar1;
  ulong uVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  if ((vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start) {
    uVar2 = 0;
    do {
      pcVar1 = ", ";
      if (uVar2 == 0) {
        pcVar1 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,(ulong)((uint)(uVar2 != 0) * 2));
      std::ostream::operator<<
                (os,(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, std::vector<T> vec) {
	os << "[";
	for (int i = 0; i < vec.size(); i++)
		os << (i == 0 ? "" : ", ") << vec[i];
	os << "]";
	return os;
}